

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_err.cpp
# Opt level: O2

void initErrorLine(void)

{
  int iVar1;
  pointer pTVar2;
  
  ErrorLine[0] = '\0';
  ErrorLine2[0] = '\0';
  if ((0xfffffffc < pass - 4U) &&
     (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
      super__Vector_impl_data._M_start !=
      sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    snprintf(ErrorLine,0x1000,"%s(%d): ",
             sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].filename,
             (ulong)sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1].line);
    iVar1 = 0;
    if (0 < IncludeLevel) {
      iVar1 = IncludeLevel;
    }
    if (iVar1 + 1 <
        (int)(((long)sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x18)) {
      pTVar2 = sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
               super__Vector_impl_data._M_finish + -3;
      if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_finish + -2 ==
          sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_start ||
          (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-2].line != skipEmitMessagePos.line ||
          sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_finish[-2].filename != skipEmitMessagePos.filename)) {
        pTVar2 = sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -2;
      }
      if ((pTVar2->line != skipEmitMessagePos.line ||
           pTVar2->filename != skipEmitMessagePos.filename) &&
         ((pTVar2->filename !=
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].filename ||
          (pTVar2->line !=
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].line)))) {
        snprintf(ErrorLine2,0x1000,"%s(%d): ^ emitted from here\n");
        return;
      }
    }
  }
  return;
}

Assistant:

static void initErrorLine() {		// adds filename + line of definition if possible
	*ErrorLine = 0;
	*ErrorLine2 = 0;
	// when OpenFile is reporting error, the filename is still nullptr, but pass==1 already
	if (pass < 1 || LASTPASS < pass || sourcePosStack.empty()) return;
	SPRINTF2(ErrorLine, LINEMAX2, "%s(%d): ", sourcePosStack.back().filename, sourcePosStack.back().line);
	// if the error filename:line is not identical with current source line, add ErrorLine2 about emit
	if (std::max(1, aint(IncludeLevel + 1)) < aint(sourcePosStack.size())) {
		auto previous = sourcePosStack.end() - 2;
		if (*previous == skipEmitMessagePos && previous != sourcePosStack.begin()) --previous;
		if (*previous != skipEmitMessagePos && *previous != sourcePosStack.back()) {
			SPRINTF2(ErrorLine2, LINEMAX2, "%s(%d): ^ emitted from here\n", previous->filename, previous->line);
		}
	}
}